

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int moveto_op_comp(lyxp_set *set1,lyxp_set *set2,char *op,lyd_node *cur_node,lys_module *param_5,
                  int options)

{
  int iVar1;
  uint32_t uVar2;
  bool bVar3;
  long local_d8;
  int64_t i;
  undefined1 local_c8 [4];
  int result;
  lyxp_set iter2;
  lyxp_set iter1;
  int options_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  char *op_local;
  lyxp_set *set2_local;
  lyxp_set *set1_local;
  
  iter2._56_4_ = 0;
  if ((set1->type == LYXP_SET_EMPTY) || (set2->type == LYXP_SET_EMPTY)) {
    set_fill_boolean(set1,0);
  }
  else if ((set1->type == LYXP_SET_NODE_SET) || (set2->type == LYXP_SET_NODE_SET)) {
    if (set1->type == LYXP_SET_NODE_SET) {
      for (local_d8 = 0; local_d8 < (long)(ulong)set1->used; local_d8 = local_d8 + 1) {
        uVar2 = (uint32_t)local_d8;
        if (set2->type == LYXP_SET_BOOLEAN) {
          iVar1 = set_comp_cast((lyxp_set *)&iter2.field_0x38,set1,LYXP_SET_BOOLEAN,cur_node,param_5
                                ,uVar2,options);
          if (iVar1 != 0) {
            return -1;
          }
        }
        else if (set2->type == LYXP_SET_NUMBER) {
          iVar1 = set_comp_cast((lyxp_set *)&iter2.field_0x38,set1,LYXP_SET_NUMBER,cur_node,param_5,
                                uVar2,options);
          if (iVar1 != 0) {
            return -1;
          }
        }
        else {
          iVar1 = set_comp_cast((lyxp_set *)&iter2.field_0x38,set1,LYXP_SET_STRING,cur_node,param_5,
                                uVar2,options);
          if (iVar1 != 0) {
            return -1;
          }
        }
        iVar1 = moveto_op_comp((lyxp_set *)&iter2.field_0x38,set2,op,cur_node,param_5,options);
        if (iVar1 != 0) {
          set_free_content((lyxp_set *)&iter2.field_0x38);
          return -1;
        }
        if (iter1._8_4_ != 0) {
          set_fill_boolean(set1,1);
          return 0;
        }
      }
    }
    else {
      for (local_d8 = 0; local_d8 < (long)(ulong)set2->used; local_d8 = local_d8 + 1) {
        uVar2 = (uint32_t)local_d8;
        if (set1->type == LYXP_SET_BOOLEAN) {
          iVar1 = set_comp_cast((lyxp_set *)local_c8,set2,LYXP_SET_BOOLEAN,cur_node,param_5,uVar2,
                                options);
          if (iVar1 != 0) {
            return -1;
          }
        }
        else if (set1->type == LYXP_SET_NUMBER) {
          iVar1 = set_comp_cast((lyxp_set *)local_c8,set2,LYXP_SET_NUMBER,cur_node,param_5,uVar2,
                                options);
          if (iVar1 != 0) {
            return -1;
          }
        }
        else {
          iVar1 = set_comp_cast((lyxp_set *)local_c8,set2,LYXP_SET_STRING,cur_node,param_5,uVar2,
                                options);
          if (iVar1 != 0) {
            return -1;
          }
        }
        set_fill_set((lyxp_set *)&iter2.field_0x38,set1);
        iVar1 = moveto_op_comp((lyxp_set *)&iter2.field_0x38,(lyxp_set *)local_c8,op,cur_node,
                               param_5,options);
        if (iVar1 != 0) {
          set_free_content((lyxp_set *)&iter2.field_0x38);
          set_free_content((lyxp_set *)local_c8);
          return -1;
        }
        set_free_content((lyxp_set *)local_c8);
        if (iter1._8_4_ != 0) {
          set_fill_boolean(set1,1);
          return 0;
        }
      }
    }
    set_fill_boolean(set1,0);
  }
  else {
    if ((*op == '=') || (*op == '!')) {
      if ((set1->type == LYXP_SET_BOOLEAN) || (set2->type == LYXP_SET_BOOLEAN)) {
        lyxp_set_cast(set1,LYXP_SET_BOOLEAN,cur_node,param_5,options);
        lyxp_set_cast(set2,LYXP_SET_BOOLEAN,cur_node,param_5,options);
      }
      else if ((set1->type == LYXP_SET_NUMBER) || (set2->type == LYXP_SET_NUMBER)) {
        iVar1 = lyxp_set_cast(set1,LYXP_SET_NUMBER,cur_node,param_5,options);
        if (iVar1 != 0) {
          return -1;
        }
        iVar1 = lyxp_set_cast(set2,LYXP_SET_NUMBER,cur_node,param_5,options);
        if (iVar1 != 0) {
          return -1;
        }
      }
    }
    else {
      iVar1 = lyxp_set_cast(set1,LYXP_SET_NUMBER,cur_node,param_5,options);
      if (iVar1 != 0) {
        return -1;
      }
      iVar1 = lyxp_set_cast(set2,LYXP_SET_NUMBER,cur_node,param_5,options);
      if (iVar1 != 0) {
        return -1;
      }
    }
    if (set1->type != set2->type) {
      __assert_fail("set1->type == set2->type",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1a2b,
                    "int moveto_op_comp(struct lyxp_set *, struct lyxp_set *, const char *, struct lyd_node *, struct lys_module *, int)"
                   );
    }
    if (*op == '=') {
      if (set1->type == LYXP_SET_BOOLEAN) {
        i._4_4_ = (uint)((set1->val).bool == (set2->val).bool);
      }
      else if (set1->type == LYXP_SET_NUMBER) {
        i._4_4_ = (uint)((set1->val).num == (set2->val).num);
      }
      else {
        if (set1->type != LYXP_SET_STRING) {
          __assert_fail("set1->type == LYXP_SET_STRING",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1a34,
                        "int moveto_op_comp(struct lyxp_set *, struct lyxp_set *, const char *, struct lyd_node *, struct lys_module *, int)"
                       );
        }
        i._4_4_ = ly_strequal_((set1->val).str,(set2->val).str);
      }
    }
    else {
      if (*op == '!') {
        if (set1->type == LYXP_SET_BOOLEAN) {
          bVar3 = (set1->val).bool != (set2->val).bool;
        }
        else if (set1->type == LYXP_SET_NUMBER) {
          bVar3 = (set1->val).num != (set2->val).num;
        }
        else {
          if (set1->type != LYXP_SET_STRING) {
            __assert_fail("set1->type == LYXP_SET_STRING",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                          ,0x1a3d,
                          "int moveto_op_comp(struct lyxp_set *, struct lyxp_set *, const char *, struct lyd_node *, struct lys_module *, int)"
                         );
          }
          iVar1 = ly_strequal_((set1->val).str,(set2->val).str);
          bVar3 = (bool)((iVar1 != 0 ^ 0xffU) & 1);
        }
      }
      else {
        if (set1->type != LYXP_SET_NUMBER) {
          __assert_fail("set1->type == LYXP_SET_NUMBER",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1a41,
                        "int moveto_op_comp(struct lyxp_set *, struct lyxp_set *, const char *, struct lyd_node *, struct lys_module *, int)"
                       );
        }
        if (*op == '<') {
          if (op[1] == '=') {
            bVar3 = (set1->val).num <= (set2->val).num;
          }
          else {
            bVar3 = (set1->val).num < (set2->val).num;
          }
        }
        else if (op[1] == '=') {
          bVar3 = (set2->val).num <= (set1->val).num;
        }
        else {
          bVar3 = (set2->val).num < (set1->val).num;
        }
      }
      i._4_4_ = (uint)bVar3;
    }
    if (i._4_4_ == 0) {
      set_fill_boolean(set1,0);
    }
    else {
      set_fill_boolean(set1,1);
    }
  }
  return 0;
}

Assistant:

static int
moveto_op_comp(struct lyxp_set *set1, struct lyxp_set *set2, const char *op, struct lyd_node *cur_node,
               struct lys_module *local_mod, int options)
{
    /*
     * NODE SET + NODE SET = NODE SET + STRING /(1 NODE SET) 2 STRING
     * NODE SET + STRING = STRING + STRING     /1 STRING (2 STRING)
     * NODE SET + NUMBER = NUMBER + NUMBER     /1 NUMBER (2 NUMBER)
     * NODE SET + BOOLEAN = BOOLEAN + BOOLEAN  /1 BOOLEAN (2 BOOLEAN)
     * STRING + NODE SET = STRING + STRING     /(1 STRING) 2 STRING
     * NUMBER + NODE SET = NUMBER + NUMBER     /(1 NUMBER) 2 NUMBER
     * BOOLEAN + NODE SET = BOOLEAN + BOOLEAN  /(1 BOOLEAN) 2 BOOLEAN
     *
     * '=' or '!='
     * BOOLEAN + BOOLEAN
     * BOOLEAN + STRING = BOOLEAN + BOOLEAN    /(1 BOOLEAN) 2 BOOLEAN
     * BOOLEAN + NUMBER = BOOLEAN + BOOLEAN    /(1 BOOLEAN) 2 BOOLEAN
     * STRING + BOOLEAN = BOOLEAN + BOOLEAN    /1 BOOLEAN (2 BOOLEAN)
     * NUMBER + BOOLEAN = BOOLEAN + BOOLEAN    /1 BOOLEAN (2 BOOLEAN)
     * NUMBER + NUMBER
     * NUMBER + STRING = NUMBER + NUMBER       /(1 NUMBER) 2 NUMBER
     * STRING + NUMBER = NUMBER + NUMBER       /1 NUMBER (2 NUMBER)
     * STRING + STRING
     *
     * '<=', '<', '>=', '>'
     * NUMBER + NUMBER
     * BOOLEAN + BOOLEAN = NUMBER + NUMBER     /1 NUMBER, 2 NUMBER
     * BOOLEAN + NUMBER = NUMBER + NUMBER      /1 NUMBER (2 NUMBER)
     * BOOLEAN + STRING = NUMBER + NUMBER      /1 NUMBER, 2 NUMBER
     * NUMBER + STRING = NUMBER + NUMBER       /(1 NUMBER) 2 NUMBER
     * STRING + STRING = NUMBER + NUMBER       /1 NUMBER, 2 NUMBER
     * STRING + NUMBER = NUMBER + NUMBER       /1 NUMBER (2 NUMBER)
     * NUMBER + BOOLEAN = NUMBER + NUMBER      /(1 NUMBER) 2 NUMBER
     * STRING + BOOLEAN = NUMBER + NUMBER      /(1 NUMBER) 2 NUMBER
     */
    struct lyxp_set iter1, iter2;
    int result;
    int64_t i;

    iter1.type = LYXP_SET_EMPTY;

    /* empty node-sets are always false */
    if ((set1->type == LYXP_SET_EMPTY) || (set2->type == LYXP_SET_EMPTY)) {
        set_fill_boolean(set1, 0);
        return EXIT_SUCCESS;
    }

    /* iterative evaluation with node-sets */
    if ((set1->type == LYXP_SET_NODE_SET) || (set2->type == LYXP_SET_NODE_SET)) {
        if (set1->type == LYXP_SET_NODE_SET) {
            for (i = 0; i < set1->used; ++i) {
                switch (set2->type) {
                case LYXP_SET_NUMBER:
                    if (set_comp_cast(&iter1, set1, LYXP_SET_NUMBER, cur_node, local_mod, i, options)) {
                        return -1;
                    }
                    break;
                case LYXP_SET_BOOLEAN:
                    if (set_comp_cast(&iter1, set1, LYXP_SET_BOOLEAN, cur_node, local_mod, i, options)) {
                        return -1;
                    }
                    break;
                default:
                    if (set_comp_cast(&iter1, set1, LYXP_SET_STRING, cur_node, local_mod, i, options)) {
                        return -1;
                    }
                    break;
                }

                if (moveto_op_comp(&iter1, set2, op, cur_node, local_mod, options)) {
                    set_free_content(&iter1);
                    return -1;
                }

                /* lazy evaluation until true */
                if (iter1.val.bool) {
                    set_fill_boolean(set1, 1);
                    return EXIT_SUCCESS;
                }
            }
        } else {
            for (i = 0; i < set2->used; ++i) {
                switch (set1->type) {
                    case LYXP_SET_NUMBER:
                        if (set_comp_cast(&iter2, set2, LYXP_SET_NUMBER, cur_node, local_mod, i, options)) {
                            return -1;
                        }
                        break;
                    case LYXP_SET_BOOLEAN:
                        if (set_comp_cast(&iter2, set2, LYXP_SET_BOOLEAN, cur_node, local_mod, i, options)) {
                            return -1;
                        }
                        break;
                    default:
                        if (set_comp_cast(&iter2, set2, LYXP_SET_STRING, cur_node, local_mod, i, options)) {
                            return -1;
                        }
                        break;
                }

                set_fill_set(&iter1, set1);

                if (moveto_op_comp(&iter1, &iter2, op, cur_node, local_mod, options)) {
                    set_free_content(&iter1);
                    set_free_content(&iter2);
                    return -1;
                }
                set_free_content(&iter2);

                /* lazy evaluation until true */
                if (iter1.val.bool) {
                    set_fill_boolean(set1, 1);
                    return EXIT_SUCCESS;
                }
            }
        }

        /* false for all nodes */
        set_fill_boolean(set1, 0);
        return EXIT_SUCCESS;
    }

    /* first convert properly */
    if ((op[0] == '=') || (op[0] == '!')) {
        if ((set1->type == LYXP_SET_BOOLEAN) || (set2->type == LYXP_SET_BOOLEAN)) {
            lyxp_set_cast(set1, LYXP_SET_BOOLEAN, cur_node, local_mod, options);
            lyxp_set_cast(set2, LYXP_SET_BOOLEAN, cur_node, local_mod, options);
        } else if ((set1->type == LYXP_SET_NUMBER) || (set2->type == LYXP_SET_NUMBER)) {
            if (lyxp_set_cast(set1, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
                return -1;
            }
            if (lyxp_set_cast(set2, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
                return -1;
            }
        } /* else we have 2 strings */
    } else {
        if (lyxp_set_cast(set1, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
            return -1;
        }
        if (lyxp_set_cast(set2, LYXP_SET_NUMBER, cur_node, local_mod, options)) {
            return -1;
        }
    }

    assert(set1->type == set2->type);

    /* compute result */
    if (op[0] == '=') {
        if (set1->type == LYXP_SET_BOOLEAN) {
            result = (set1->val.bool == set2->val.bool);
        } else if (set1->type == LYXP_SET_NUMBER) {
            result = (set1->val.num == set2->val.num);
        } else {
            assert(set1->type == LYXP_SET_STRING);
            result = (ly_strequal(set1->val.str, set2->val.str, 0));
        }
    } else if (op[0] == '!') {
        if (set1->type == LYXP_SET_BOOLEAN) {
            result = (set1->val.bool != set2->val.bool);
        } else if (set1->type == LYXP_SET_NUMBER) {
            result = (set1->val.num != set2->val.num);
        } else {
            assert(set1->type == LYXP_SET_STRING);
            result = (!ly_strequal(set1->val.str, set2->val.str, 0));
        }
    } else {
        assert(set1->type == LYXP_SET_NUMBER);
        if (op[0] == '<') {
            if (op[1] == '=') {
                result = (set1->val.num <= set2->val.num);
            } else {
                result = (set1->val.num < set2->val.num);
            }
        } else {
            if (op[1] == '=') {
                result = (set1->val.num >= set2->val.num);
            } else {
                result = (set1->val.num > set2->val.num);
            }
        }
    }

    /* assign result */
    if (result) {
        set_fill_boolean(set1, 1);
    } else {
        set_fill_boolean(set1, 0);
    }

    return EXIT_SUCCESS;
}